

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void flatbuffers::IterateValue
               (ElementaryType type,uint8_t *val,TypeTable *type_table,uint8_t *prev_val,
               soffset_t vector_index,IterationVisitor *visitor)

{
  byte bVar1;
  char *pcVar2;
  int64_t iVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  
  switch(type) {
  case ET_UTYPE:
    uVar5 = (uint)*val;
    pcVar2 = EnumName<unsigned_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[3];
    break;
  case ET_BOOL:
    (*visitor->_vptr_IterationVisitor[4])(visitor,(ulong)(*val != '\0'));
    return;
  case ET_CHAR:
    uVar5 = (uint)(char)*val;
    pcVar2 = EnumName<signed_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[5];
    break;
  case ET_UCHAR:
    uVar5 = (uint)*val;
    pcVar2 = EnumName<unsigned_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[6];
    break;
  case ET_SHORT:
    uVar5 = (uint)*(short *)val;
    pcVar2 = EnumName<short>(*(short *)val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[7];
    break;
  case ET_USHORT:
    uVar5 = (uint)*(ushort *)val;
    pcVar2 = EnumName<unsigned_short>(*(ushort *)val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[8];
    break;
  case ET_INT:
    uVar5 = *(uint *)val;
    pcVar2 = EnumName<int>(uVar5,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[9];
    break;
  case ET_UINT:
    uVar5 = *(uint *)val;
    pcVar2 = EnumName<unsigned_int>(uVar5,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[10];
    break;
  case ET_LONG:
    val = *(uint8_t **)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xb];
    goto LAB_00173dc5;
  case ET_ULONG:
    val = *(uint8_t **)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xc];
    goto LAB_00173dc5;
  case ET_FLOAT:
    uVar6 = (ulong)*(uint *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xd];
    goto LAB_00173d08;
  case ET_DOUBLE:
    uVar6 = *(ulong *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xe];
LAB_00173d08:
    (*UNRECOVERED_JUMPTABLE)(uVar6,visitor);
    return;
  case ET_STRING:
    val = val + *(uint *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xf];
    goto LAB_00173dc5;
  case ET_SEQUENCE:
    switch(type_table->st) {
    case ST_TABLE:
      val = val + *(uint *)val;
      break;
    case ST_STRUCT:
      break;
    case ST_UNION:
      if (prev_val == (uint8_t *)0x0) {
        __assert_fail("prev_val",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                      ,0xc2,
                      "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                     );
      }
      uVar5 = *(uint *)val;
      if (vector_index < 0) {
        bVar1 = *prev_val;
      }
      else {
        bVar1 = Vector<unsigned_char,_unsigned_int>::Get
                          ((Vector<unsigned_char,_unsigned_int> *)prev_val,vector_index);
      }
      val = val + uVar5;
      iVar3 = LookupEnum((ulong)bVar1,type_table->values,type_table->num_elems);
      if ((-1 < iVar3) && (iVar3 < (int)type_table->num_elems)) {
        uVar4 = (ushort)type_table->type_codes[iVar3] & 0xf;
        if (uVar4 == 0xc) {
          UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xf];
          goto LAB_00173dc5;
        }
        if (uVar4 == 0xd) {
          type_table = (*type_table->type_refs
                         [(short)((uint)(int)(short)type_table->type_codes[iVar3] >> 5)])();
          break;
        }
      }
      goto switchD_00173bca_default;
    case ST_ENUM:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                    ,0xdd,
                    "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                   );
    default:
      return;
    }
    IterateObject(val,type_table,visitor);
    return;
  default:
switchD_00173bca_default:
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0x10];
LAB_00173dc5:
    (*UNRECOVERED_JUMPTABLE)(visitor,val);
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(visitor,(ulong)uVar5,pcVar2,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

inline void IterateValue(ElementaryType type, const uint8_t *val,
                         const TypeTable *type_table, const uint8_t *prev_val,
                         soffset_t vector_index, IterationVisitor *visitor) {
  switch (type) {
    case ET_UTYPE: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UType(tval, EnumName(tval, type_table));
      break;
    }
    case ET_BOOL: {
      visitor->Bool(ReadScalar<uint8_t>(val) != 0);
      break;
    }
    case ET_CHAR: {
      auto tval = ReadScalar<int8_t>(val);
      visitor->Char(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UCHAR: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UChar(tval, EnumName(tval, type_table));
      break;
    }
    case ET_SHORT: {
      auto tval = ReadScalar<int16_t>(val);
      visitor->Short(tval, EnumName(tval, type_table));
      break;
    }
    case ET_USHORT: {
      auto tval = ReadScalar<uint16_t>(val);
      visitor->UShort(tval, EnumName(tval, type_table));
      break;
    }
    case ET_INT: {
      auto tval = ReadScalar<int32_t>(val);
      visitor->Int(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UINT: {
      auto tval = ReadScalar<uint32_t>(val);
      visitor->UInt(tval, EnumName(tval, type_table));
      break;
    }
    case ET_LONG: {
      visitor->Long(ReadScalar<int64_t>(val));
      break;
    }
    case ET_ULONG: {
      visitor->ULong(ReadScalar<uint64_t>(val));
      break;
    }
    case ET_FLOAT: {
      visitor->Float(ReadScalar<float>(val));
      break;
    }
    case ET_DOUBLE: {
      visitor->Double(ReadScalar<double>(val));
      break;
    }
    case ET_STRING: {
      val += ReadScalar<uoffset_t>(val);
      visitor->String(reinterpret_cast<const String *>(val));
      break;
    }
    case ET_SEQUENCE: {
      switch (type_table->st) {
        case ST_TABLE:
          val += ReadScalar<uoffset_t>(val);
          IterateObject(val, type_table, visitor);
          break;
        case ST_STRUCT: IterateObject(val, type_table, visitor); break;
        case ST_UNION: {
          val += ReadScalar<uoffset_t>(val);
          FLATBUFFERS_ASSERT(prev_val);
          auto union_type = *prev_val;  // Always a uint8_t.
          if (vector_index >= 0) {
            auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(prev_val);
            union_type = type_vec->Get(static_cast<uoffset_t>(vector_index));
          }
          auto type_code_idx =
              LookupEnum(union_type, type_table->values, type_table->num_elems);
          if (type_code_idx >= 0 &&
              type_code_idx < static_cast<int32_t>(type_table->num_elems)) {
            auto type_code = type_table->type_codes[type_code_idx];
            switch (type_code.base_type) {
              case ET_SEQUENCE: {
                auto ref = type_table->type_refs[type_code.sequence_ref]();
                IterateObject(val, ref, visitor);
                break;
              }
              case ET_STRING:
                visitor->String(reinterpret_cast<const String *>(val));
                break;
              default: visitor->Unknown(val);
            }
          } else {
            visitor->Unknown(val);
          }
          break;
        }
        case ST_ENUM: FLATBUFFERS_ASSERT(false); break;
      }
      break;
    }
    default: {
      visitor->Unknown(val);
      break;
    }
  }
}